

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_4>::Run
          (AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_4> *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  long lVar2;
  GLenum target;
  ImageSizeMachine machine;
  undefined1 *puStack_a8;
  int aiStack_a0 [28];
  
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  target = 0x8c1a;
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->m_texture[0]);
  lVar2 = 0;
  do {
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D(this_00,target,0,0x8d70,2,2,7,0,0x8d99,0x1405,(void *)0x0);
    glu::CallLogWrapper::glTexImage3D(this_00,target,1,0x8d70,1,1,7,0,0x8d99,0x1405,(void *)0x0);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[lVar2],1,'\0',3,35000,0x8d70);
    lVar1 = lVar2 + 1;
    target = *(GLenum *)(&DAT_01aa0b64 + lVar2 * 4);
    glu::CallLogWrapper::glBindTexture(this_00,target,this->m_texture[lVar2 + 1]);
    lVar2 = lVar1;
  } while (lVar1 != 6);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x400,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glTexBufferRange(this_00,0x8c2a,0x8d70,this->m_buffer,0x100,0x200);
  glu::CallLogWrapper::glBindImageTexture(this_00,7,this->m_texture[6],0,'\0',0,0x88b9,0x8d70);
  ImageSizeMachine::ImageSizeMachine(&machine);
  puStack_a8 = &DAT_100000001;
  aiStack_a0[0] = 0;
  aiStack_a0[1] = 0;
  aiStack_a0[2] = 2;
  aiStack_a0[3] = 2;
  aiStack_a0[4] = 1;
  aiStack_a0[5] = 0;
  aiStack_a0[6] = 2;
  aiStack_a0[7] = 2;
  aiStack_a0[8] = 0;
  aiStack_a0[9] = 0;
  aiStack_a0[10] = 2;
  aiStack_a0[0xb] = 2;
  aiStack_a0[0xc] = 3;
  aiStack_a0[0xd] = 0;
  aiStack_a0[0xe] = 0x7b;
  aiStack_a0[0xf] = 0xb;
  aiStack_a0[0x10] = 0;
  aiStack_a0[0x11] = 0;
  aiStack_a0[0x12] = 6;
  aiStack_a0[0x13] = 3;
  aiStack_a0[0x14] = 4;
  aiStack_a0[0x15] = 0;
  aiStack_a0[0x16] = 0x20;
  aiStack_a0[0x17] = 0;
  aiStack_a0[0x18] = 0;
  aiStack_a0[0x19] = 0;
  lVar2 = gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
                    ((ImageSizeMachine *)&machine,4,false,(ivec4 *)&puStack_a8,true);
  ImageSizeMachine::~ImageSizeMachine(&machine);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 8))
			return NOT_SUPPORTED;

		const GLenum target[7] = { GL_TEXTURE_2D_ARRAY,		  GL_TEXTURE_3D,		GL_TEXTURE_CUBE_MAP_ARRAY,
								   GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_ARRAY,
								   GL_TEXTURE_BUFFER };
		for (int i = 0; i < 7; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] != GL_TEXTURE_BUFFER)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 2, 2, 7, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 1, 1, 7, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 3, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 4, 4, 2, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 2, 2, 1, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 2, TexInternalFormat<T>(), 1, 1, 1, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(2, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 2, 2, 12, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 1, 1, 12, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 1, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 4, 4, 18, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 2, 2, 18, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 2, TexInternalFormat<T>(), 1, 1, 18, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(4, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 4)
			{
				glTexImage2D(target[i], 0, TexInternalFormat<T>(), 123, 11, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(5, m_texture[i], 0, GL_FALSE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 5)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 13, 7, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 6, 3, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 2, TexInternalFormat<T>(), 3, 1, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 3, TexInternalFormat<T>(), 1, 1, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(6, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 6)
			{
				glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
				glBufferData(GL_TEXTURE_BUFFER, 1024, NULL, GL_STATIC_DRAW);
				glTexBufferRange(GL_TEXTURE_BUFFER, TexInternalFormat<T>(), m_buffer, 256, 512);
				glBindImageTexture(7, m_texture[i], 0, GL_FALSE, 0, GL_WRITE_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(1, 1, 0, 0),	ivec4(2, 2, 1, 0), ivec4(2, 2, 0, 0), ivec4(2, 2, 3, 0),
						 ivec4(123, 11, 0, 0), ivec4(6, 3, 4, 0), ivec4(32, 0, 0, 0) };
		return machine.Run<T>(STAGE, false, res, true);
	}